

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O1

void __thiscall
sptk::GaussianMixtureModeling::FloorVariance
          (GaussianMixtureModeling *this,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          )

{
  double dVar1;
  double *pdVar2;
  int column;
  long local_58;
  Row local_50;
  double local_38;
  
  if (0 < this->num_mixture_) {
    local_58 = 0;
    do {
      if (-1 < this->num_order_) {
        column = -1;
        do {
          column = column + 1;
          local_50.matrix_ =
               (covariance_matrices->
               super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>).
               _M_impl.super__Vector_impl_data._M_start + local_58;
          local_50._vptr_Row = (_func_int **)&PTR__Row_00117bb0;
          local_50.row_ = column;
          pdVar2 = SymmetricMatrix::Row::operator[](&local_50,column);
          dVar1 = this->variance_floor_;
          if (*pdVar2 <= dVar1 && dVar1 != *pdVar2) {
            local_50.matrix_ =
                 (covariance_matrices->
                 super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>).
                 _M_impl.super__Vector_impl_data._M_start + local_58;
            local_50._vptr_Row = (_func_int **)&PTR__Row_00117bb0;
            local_50.row_ = column;
            local_38 = dVar1;
            pdVar2 = SymmetricMatrix::Row::operator[](&local_50,column);
            *pdVar2 = local_38;
          }
        } while (column < this->num_order_);
      }
      local_58 = local_58 + 1;
    } while (local_58 < this->num_mixture_);
  }
  return;
}

Assistant:

void GaussianMixtureModeling::FloorVariance(
    std::vector<SymmetricMatrix>* covariance_matrices) const {
  for (int k(0); k < num_mixture_; ++k) {
    for (int l(0); l <= num_order_; ++l) {
      if ((*covariance_matrices)[k][l][l] < variance_floor_) {
        (*covariance_matrices)[k][l][l] = variance_floor_;
      }
    }
  }
}